

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_regions.cpp
# Opt level: O0

void __thiscall
Am_Region_Impl::Intersect
          (Am_Region_Impl *this,int the_left,int the_top,uint the_width,uint the_height)

{
  value_type p_Var1;
  bool bVar2;
  undefined8 uVar3;
  reference pp_Var4;
  Region rect_region;
  XRectangle x_rect;
  uint the_height_local;
  uint the_width_local;
  int the_top_local;
  int the_left_local;
  Am_Region_Impl *this_local;
  
  bVar2 = std::stack<_XRegion_*,_std::deque<_XRegion_*,_std::allocator<_XRegion_*>_>_>::empty
                    (&this->stack);
  if (bVar2) {
    x_rect = (XRectangle)XCreateRegion();
    std::stack<_XRegion_*,_std::deque<_XRegion_*,_std::allocator<_XRegion_*>_>_>::push
              (&this->stack,(value_type *)&x_rect);
  }
  else {
    rect_region._0_2_ = (undefined2)the_left;
    rect_region._2_2_ = (undefined2)the_top;
    rect_region._4_2_ = (undefined2)the_width;
    rect_region._6_2_ = (undefined2)the_height;
    uVar3 = XCreateRegion();
    XUnionRectWithRegion(&rect_region,uVar3,uVar3);
    pp_Var4 = std::stack<_XRegion_*,_std::deque<_XRegion_*,_std::allocator<_XRegion_*>_>_>::top
                        (&this->stack);
    p_Var1 = *pp_Var4;
    pp_Var4 = std::stack<_XRegion_*,_std::deque<_XRegion_*,_std::allocator<_XRegion_*>_>_>::top
                        (&this->stack);
    XIntersectRegion(uVar3,p_Var1,*pp_Var4);
    XDestroyRegion(uVar3);
  }
  return;
}

Assistant:

void
Am_Region_Impl::Intersect(int the_left, int the_top, unsigned int the_width,
                          unsigned int the_height)
{
  if (stack.empty()) {
    // Create a new region for top if needed
    stack.push(XCreateRegion());
  } else {
    // Set up a rectangle
    XRectangle x_rect; // was static ???
    x_rect.x = the_left;
    x_rect.y = the_top;
    x_rect.width = the_width;
    x_rect.height = the_height;
    Region rect_region = XCreateRegion();
    XUnionRectWithRegion(&x_rect, rect_region, rect_region);
    // Does the intersection
    XIntersectRegion(rect_region, stack.top(), stack.top());
    XDestroyRegion(rect_region);
  }
}